

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall Vector_AngleBetween_Test::TestBody(Vector_AngleBetween_Test *this)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined2 uVar20;
  undefined6 uVar21;
  undefined2 uVar22;
  undefined6 uVar23;
  float *expected;
  long lVar24;
  long lVar25;
  char *pcVar26;
  int i;
  uint64_t sequenceIndex;
  bool bVar27;
  undefined1 auVar28 [16];
  longdouble in_ST0;
  longdouble lVar29;
  Float FVar30;
  float fVar31;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  type tVar32;
  double dVar33;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar54 [56];
  undefined1 auVar43 [64];
  undefined1 auVar34 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar55 [16];
  undefined1 auVar57 [12];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  Vector3<float> VVar68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  Float naive;
  Tuple3<pbrt::Vector3,_float> local_138;
  Vector3<long_double> ad;
  AssertionResult gtest_ar_5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_e8 [2];
  undefined2 uStack_c0;
  undefined2 uStack_be;
  Vector3<long_double> bd;
  AssertHelper local_80;
  float local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  RNG rng;
  Float precise;
  Vector3<float> local_40;
  Float abet;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  rng.state = rng.state & 0xffffffff00000000;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  gtest_ar_5._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  bd.super_Tuple3<pbrt::Vector3,_long_double>._12_4_ =
       SUB84(bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ >> 0x20,0);
  bd.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = 0;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = uVar1;
  gtest_ar_5.message_.ptr_._0_4_ = 0.0;
  local_40.super_Tuple3<pbrt::Vector3,_float>.x =
       pbrt::AngleBetween<float>((Vector3<float> *)&bd,(Vector3<float> *)&gtest_ar_5);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&ad,"0","AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0))",(int *)&rng,
             (float *)&local_40);
  if (ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&bd);
    if (ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4b,pcVar26);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bd);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&ad.super_Tuple3<pbrt::Vector3,_long_double>.x + 8));
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0;
  bd.super_Tuple3<pbrt::Vector3,_long_double>._0_12_ = ZEXT412(0x3f800000) << 0x40;
  gtest_ar_5.message_.ptr_._0_4_ = -1.0;
  auVar41._0_4_ = pbrt::AngleBetween<float>((Vector3<float> *)&bd,(Vector3<float> *)&gtest_ar_5);
  auVar41._4_60_ = extraout_var;
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar41._0_16_,auVar28);
  rng.state = 0x3e7ad7f29abcaf48;
  local_40.super_Tuple3<pbrt::Vector3,_float>.x = auVar28._0_4_ + -3.1415927;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&ad,"std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi",
             "1e-7",(float *)&local_40,(double *)&rng);
  if (ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&bd);
    if (ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4d,pcVar26);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bd);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&ad.super_Tuple3<pbrt::Vector3,_long_double>.x + 8));
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  bd.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = 0;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = uVar1;
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0x3f800000000000;
  gtest_ar_5.message_.ptr_._0_4_ = 0.0;
  auVar42._0_4_ = pbrt::AngleBetween<float>((Vector3<float> *)&bd,(Vector3<float> *)&gtest_ar_5);
  auVar42._4_60_ = extraout_var_00;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(auVar42._0_16_,auVar8);
  rng.state = 0x3e7ad7f29abcaf48;
  local_40.super_Tuple3<pbrt::Vector3,_float>.x = auVar28._0_4_ + -1.5707964;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&ad,"std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2"
             ,"1e-7",(float *)&local_40,(double *)&rng);
  if (ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&bd);
    if (ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x4f,pcVar26);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bd);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&ad.super_Tuple3<pbrt::Vector3,_long_double>.x + 8));
  auVar54 = ZEXT856(0);
  ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = 0x41200000;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = 0xc04000003f800000;
  VVar68 = pbrt::Normalize<float>((Vector3<float> *)&ad);
  local_40.super_Tuple3<pbrt::Vector3,_float>.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar43._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar43._8_56_ = auVar54;
  auVar19._12_4_ = 0;
  auVar19._0_12_ = (undefined1  [12])bd.super_Tuple3<pbrt::Vector3,_long_double>._4_12_;
  bd.super_Tuple3<pbrt::Vector3,_long_double>._0_16_ = auVar19 << 0x20;
  local_40.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar43._0_16_);
  FVar30 = pbrt::AngleBetween<float>(&local_40,&local_40);
  gtest_ar_5._0_4_ = FVar30;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&ad,"0","AngleBetween(x, x)",(int *)&bd,(float *)&gtest_ar_5);
  if (ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&bd);
    if (ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x52,pcVar26);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bd);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&ad.super_Tuple3<pbrt::Vector3,_long_double>.x + 8));
  auVar34._0_8_ = local_40.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  auVar34._8_4_ = 0x80000000;
  auVar34._12_4_ = 0x80000000;
  uVar2 = vmovlps_avx(auVar34);
  bd.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = -local_40.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = uVar2;
  FVar30 = pbrt::AngleBetween<float>(&local_40,(Vector3<float> *)&bd);
  gtest_ar_5.success_ = true;
  gtest_ar_5._1_7_ = 0x3e9421f5f40d83;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar28 = vandps_avx512vl(ZEXT416((uint)(FVar30 + -3.1415927)),auVar9);
  rng.state = CONCAT44(rng.state._4_4_,auVar28._0_4_);
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&ad,"std::abs(AngleBetween(x, -x) - Pi)","3e-7",(float *)&rng,
             (double *)&gtest_ar_5);
  if (ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&bd);
    if (ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x53,pcVar26);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&bd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&bd);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&ad.super_Tuple3<pbrt::Vector3,_long_double>.x + 8));
  for (sequenceIndex = 0; sequenceIndex != 100000; sequenceIndex = sequenceIndex + 1) {
    pbrt::RNG::SetSequence(&rng,sequenceIndex);
    fVar31 = pbrt::RNG::Uniform<float>(&rng);
    uStack_c0 = (undefined2)extraout_XMM0_Dc;
    uStack_be = (undefined2)((uint)extraout_XMM0_Dc >> 0x10);
    local_78 = pbrt::RNG::Uniform<float>(&rng);
    auVar44._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar44._4_60_ = extraout_var_01;
    auVar62._8_4_ = 0xbf800000;
    auVar62._0_8_ = 0xbf800000bf800000;
    auVar62._12_4_ = 0xbf800000;
    auVar65._8_4_ = 0x40000000;
    auVar65._0_8_ = 0x4000000040000000;
    auVar65._12_4_ = 0x40000000;
    auVar8 = vfmadd213ss_fma(auVar44._0_16_,SUB6416(ZEXT464(0x40000000),0),
                             SUB6416(ZEXT464(0xbf800000),0));
    auVar54 = ZEXT856(auVar8._8_8_);
    auVar15._4_4_ = extraout_XMM0_Db;
    auVar15._0_4_ = fVar31;
    auVar15._8_2_ = uStack_c0;
    auVar15._10_2_ = uStack_be;
    auVar15._12_4_ = extraout_XMM0_Dd;
    auVar28 = vinsertps_avx(auVar15,ZEXT416((uint)local_78),0x10);
    auVar28 = vfmadd213ps_fma(auVar28,auVar65,auVar62);
    uVar2 = vmovlps_avx(auVar28);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = auVar8._0_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = uVar2;
    VVar68 = pbrt::Normalize<float>((Vector3<float> *)&ad);
    local_138.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar45._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar45._8_56_ = auVar54;
    local_138._0_8_ = vmovlps_avx(auVar45._0_16_);
    fVar31 = pbrt::RNG::Uniform<float>(&rng);
    uStack_c0 = (undefined2)extraout_XMM0_Dc_00;
    uStack_be = (undefined2)((uint)extraout_XMM0_Dc_00 >> 0x10);
    local_78 = pbrt::RNG::Uniform<float>(&rng);
    auVar46._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar46._4_60_ = extraout_var_02;
    auVar58._8_4_ = 0x40000000;
    auVar58._0_8_ = 0x4000000040000000;
    auVar58._12_4_ = 0x40000000;
    auVar8 = vfmadd213ss_fma(auVar46._0_16_,SUB6416(ZEXT464(0x40000000),0),ZEXT416(0xbf800000));
    auVar54 = ZEXT856(auVar8._8_8_);
    auVar16._4_4_ = extraout_XMM0_Db_00;
    auVar16._0_4_ = fVar31;
    auVar16._8_2_ = uStack_c0;
    auVar16._10_2_ = uStack_be;
    auVar16._12_4_ = extraout_XMM0_Dd_00;
    auVar28 = vinsertps_avx(auVar16,ZEXT416((uint)local_78),0x10);
    auVar10._8_4_ = 0xbf800000;
    auVar10._0_8_ = 0xbf800000bf800000;
    auVar10._12_4_ = 0xbf800000;
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar58,auVar10);
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = vmovlps_avx(auVar28);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = auVar8._0_4_;
    VVar68 = pbrt::Normalize<float>((Vector3<float> *)&ad);
    local_68.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar47._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar47._8_56_ = auVar54;
    auVar3._8_8_ = 0;
    auVar3._0_4_ = local_138.x;
    auVar3._4_4_ = local_138.y;
    ad.super_Tuple3<pbrt::Vector3,_long_double>._0_16_ = vcvtps2pd_avx(auVar3);
    ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)local_138.z;
    local_68._0_8_ = vmovlps_avx(auVar47._0_16_);
    bd.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)local_68.z;
    bd.super_Tuple3<pbrt::Vector3,_long_double>._0_16_ = vcvtps2pd_avx(auVar47._0_16_);
    pbrt::Normalize<double>((Vector3<double> *)&gtest_ar_5,(Vector3<double> *)&ad);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._12_4_ = gtest_ar_5.message_.ptr_._4_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = gtest_ar_5.message_.ptr_._0_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)aaStack_e8[0]._0_8_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
    pbrt::Normalize<double>((Vector3<double> *)&gtest_ar_5,(Vector3<double> *)&bd);
    bd.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ =
         CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
    bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
    bd.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = gtest_ar_5._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ =
         (double)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ *
         (double)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
    auVar28 = vfmadd231sd_fma(auVar55,auVar35,auVar4);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = aaStack_e8[0]._M_allocated_capacity;
    auVar28 = vfmadd132sd_fma(auVar36,auVar28,auVar5);
    dVar33 = acos(auVar28._0_8_);
    fVar31 = (float)dVar33;
    local_78 = pbrt::AngleBetween<float>((Vector3<float> *)&local_138,(Vector3<float> *)&local_68);
    local_148.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3ed4f8b588e368f1;
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl(ZEXT416((uint)(fVar31 - local_78)),auVar11);
    naive = auVar28._0_4_ / fVar31;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_5,"err","5e-6",&naive,(double *)&local_148);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      std::ostream::operator<<(local_148.ptr_ + 0x10,fVar31);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),"vs ");
      std::ostream::operator<<(local_148.ptr_ + 0x10,local_78);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),", a: ");
      pbrt::operator<<((ostream *)(local_148.ptr_ + 0x10),(Vector3<float> *)&local_138);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),", b: ");
      pbrt::operator<<((ostream *)(local_148.ptr_ + 0x10),(Vector3<float> *)&local_68);
      pcVar26 = "";
      if ((undefined8 *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
          (undefined8 *)0x0) {
        pcVar26 = *(char **)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x67,pcVar26);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_148);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
  }
  lVar24 = 100000;
  lVar25 = 0;
  while (bVar27 = lVar24 != 0, lVar24 = lVar24 + -1, bVar27) {
    pbrt::RNG::SetSequence(&rng,lVar25 + 10000000);
    fVar31 = pbrt::RNG::Uniform<float>(&rng);
    uStack_c0 = (undefined2)extraout_XMM0_Dc_01;
    uStack_be = (undefined2)((uint)extraout_XMM0_Dc_01 >> 0x10);
    local_78 = pbrt::RNG::Uniform<float>(&rng);
    auVar48._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar48._4_60_ = extraout_var_03;
    auVar63._8_4_ = 0xbf800000;
    auVar63._0_8_ = 0xbf800000bf800000;
    auVar63._12_4_ = 0xbf800000;
    auVar66._8_4_ = 0x40000000;
    auVar66._0_8_ = 0x4000000040000000;
    auVar66._12_4_ = 0x40000000;
    auVar8 = vfmadd213ss_fma(auVar48._0_16_,SUB6416(ZEXT464(0x40000000),0),
                             SUB6416(ZEXT464(0xbf800000),0));
    auVar54 = ZEXT856(auVar8._8_8_);
    auVar17._4_4_ = extraout_XMM0_Db_01;
    auVar17._0_4_ = fVar31;
    auVar17._8_2_ = uStack_c0;
    auVar17._10_2_ = uStack_be;
    auVar17._12_4_ = extraout_XMM0_Dd_01;
    auVar28 = vinsertps_avx(auVar17,ZEXT416((uint)local_78),0x10);
    auVar28 = vfmadd213ps_fma(auVar28,auVar66,auVar63);
    uVar2 = vmovlps_avx(auVar28);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = auVar8._0_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = uVar2;
    VVar68 = pbrt::Normalize<float>((Vector3<float> *)&ad);
    local_138.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar49._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar49._8_56_ = auVar54;
    local_138._0_8_ = vmovlps_avx(auVar49._0_16_);
    fVar31 = pbrt::RNG::Uniform<float>(&rng);
    uStack_c0 = (undefined2)extraout_XMM0_Dc_02;
    uStack_be = (undefined2)((uint)extraout_XMM0_Dc_02 >> 0x10);
    local_78 = pbrt::RNG::Uniform<float>(&rng);
    auVar50._0_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar50._4_60_ = extraout_var_04;
    auVar59._8_4_ = 0x40000000;
    auVar59._0_8_ = 0x4000000040000000;
    auVar59._12_4_ = 0x40000000;
    auVar8 = vfmadd213ss_fma(auVar50._0_16_,SUB6416(ZEXT464(0x40000000),0),ZEXT416(0xbf800000));
    auVar54 = ZEXT856(auVar8._8_8_);
    auVar18._4_4_ = extraout_XMM0_Db_02;
    auVar18._0_4_ = fVar31;
    auVar18._8_2_ = uStack_c0;
    auVar18._10_2_ = uStack_be;
    auVar18._12_4_ = extraout_XMM0_Dd_02;
    auVar28 = vinsertps_avx(auVar18,ZEXT416((uint)local_78),0x10);
    auVar12._8_4_ = 0xbf800000;
    auVar12._0_8_ = 0xbf800000bf800000;
    auVar12._12_4_ = 0xbf800000;
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar59,auVar12);
    auVar57 = auVar28._4_12_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_ = vmovlps_avx(auVar28);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = auVar8._0_4_;
    VVar68 = pbrt::Normalize<float>((Vector3<float> *)&ad);
    local_68.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar51._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar51._8_56_ = auVar54;
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    local_68._0_8_ = vmovlps_avx(auVar51._0_16_);
    auVar64._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
    auVar64._8_4_ = auVar54._0_4_ ^ 0x80000000;
    auVar64._12_4_ = auVar54._4_4_ ^ 0x80000000;
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar60._8_8_ = 0;
    auVar60._0_4_ = local_138.x;
    auVar60._4_4_ = local_138.y;
    auVar28 = vpternlogd_avx512vl(auVar64,auVar60,auVar13,0xd8);
    auVar61._0_8_ = CONCAT44(auVar57._0_4_,local_68.z) ^ 0x8000000080000000;
    auVar61._8_4_ = auVar57._4_4_ ^ 0x80000000;
    auVar61._12_4_ = auVar57._8_4_ ^ 0x80000000;
    bd.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)local_68.z;
    local_138._0_8_ = auVar28._0_8_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>._0_16_ = vcvtps2pd_avx(auVar28);
    auVar28 = vpternlogd_avx512vl(ZEXT416((uint)local_138.z),auVar67,auVar61,0xe2);
    local_138.z = auVar28._0_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)local_138.z;
    bd.super_Tuple3<pbrt::Vector3,_long_double>._0_16_ = vcvtps2pd_avx(auVar51._0_16_);
    pbrt::Normalize<double>((Vector3<double> *)&gtest_ar_5,(Vector3<double> *)&ad);
    ad.super_Tuple3<pbrt::Vector3,_long_double>._12_4_ = gtest_ar_5.message_.ptr_._4_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = gtest_ar_5.message_.ptr_._0_4_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = (double)aaStack_e8[0]._0_8_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
    ad.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
    pbrt::Normalize<double>((Vector3<double> *)&gtest_ar_5,(Vector3<double> *)&bd);
    bd.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ =
         CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
    bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
    bd.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = gtest_ar_5._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         (double)ad.super_Tuple3<pbrt::Vector3,_long_double>._8_8_ *
         (double)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
    auVar28 = vfmadd231sd_fma(auVar56,auVar37,auVar6);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = aaStack_e8[0]._M_allocated_capacity;
    auVar28 = vfmadd132sd_fma(auVar38,auVar28,auVar7);
    dVar33 = acos(auVar28._0_8_);
    fVar31 = (float)dVar33;
    local_78 = pbrt::AngleBetween<float>((Vector3<float> *)&local_138,(Vector3<float> *)&local_68);
    local_148.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x3ed4f8b588e368f1;
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl(ZEXT416((uint)(fVar31 - local_78)),auVar14);
    naive = auVar28._0_4_ / fVar31;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&gtest_ar_5,"err","5e-6",&naive,(double *)&local_148);
    if (gtest_ar_5.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      std::ostream::operator<<(local_148.ptr_ + 0x10,fVar31);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),"vs ");
      std::ostream::operator<<(local_148.ptr_ + 0x10,local_78);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),", a: ");
      pbrt::operator<<((ostream *)(local_148.ptr_ + 0x10),(Vector3<float> *)&local_138);
      std::operator<<((ostream *)(local_148.ptr_ + 0x10),", b: ");
      pbrt::operator<<((ostream *)(local_148.ptr_ + 0x10),(Vector3<float> *)&local_68);
      pcVar26 = "";
      if ((undefined8 *)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_) !=
          (undefined8 *)0x0) {
        pcVar26 = *(char **)CONCAT44(gtest_ar_5.message_.ptr_._4_4_,gtest_ar_5.message_.ptr_._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
                 ,0x82,pcVar26);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_148);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_5.message_);
    lVar25 = lVar25 + 1;
  }
  auVar39._8_4_ = 0x3f800000;
  auVar39._0_8_ = 0x3f8000003f800000;
  auVar39._12_4_ = 0x3f800000;
  local_138._0_8_ = vmovlps_avx(auVar39);
  auVar54 = ZEXT856(0);
  local_138.z = 1.0;
  local_68.x = -1.0;
  local_68.y = -1.0001;
  local_68.z = -1.0;
  VVar68 = pbrt::Normalize<float>((Vector3<float> *)&local_138);
  local_138.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar52._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar52._8_56_ = auVar54;
  local_138._0_8_ = vmovlps_avx(auVar52._0_16_);
  VVar68 = pbrt::Normalize<float>((Vector3<float> *)&local_68);
  local_68.z = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar53._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar53._8_56_ = auVar54;
  local_68._0_8_ = vmovlps_avx(auVar53._0_16_);
  lVar29 = (longdouble)1;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.x = lVar29;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = SUB108(lVar29,0);
  ad.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_ = (undefined2)((unkuint10)lVar29 >> 0x40);
  lVar29 = -lVar29;
  uStack_c0 = (undefined2)((unkuint10)lVar29 >> 0x40);
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x = lVar29;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_ = SUB108((longdouble)-1.0001,0);
  bd.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_ =
       (undefined2)((unkuint10)(longdouble)-1.0001 >> 0x40);
  bd.super_Tuple3<pbrt::Vector3,_long_double>.z._0_8_ = SUB108(lVar29,0);
  ad.super_Tuple3<pbrt::Vector3,_long_double>.z._0_8_ =
       ad.super_Tuple3<pbrt::Vector3,_long_double>.y._0_8_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.z._8_2_ =
       ad.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.z._8_2_ = uStack_c0;
  pbrt::Normalize<long_double>((Vector3<long_double> *)&gtest_ar_5,&ad);
  ad.super_Tuple3<pbrt::Vector3,_long_double>._12_4_ = gtest_ar_5.message_.ptr_._4_4_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = gtest_ar_5.message_.ptr_._0_4_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.z._8_2_ = (undefined2)aaStack_e8[1]._8_8_;
  uVar22 = ad.super_Tuple3<pbrt::Vector3,_long_double>.z._8_2_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>._42_6_ = SUB86((ulong)aaStack_e8[1]._8_8_ >> 0x10,0);
  uVar23 = ad.super_Tuple3<pbrt::Vector3,_long_double>._42_6_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_ = (undefined2)aaStack_e8[0]._8_8_;
  uVar20 = ad.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_;
  ad.super_Tuple3<pbrt::Vector3,_long_double>._26_6_ = SUB86((ulong)aaStack_e8[0]._8_8_ >> 0x10,0);
  uVar21 = ad.super_Tuple3<pbrt::Vector3,_long_double>._26_6_;
  pbrt::Normalize<long_double>((Vector3<long_double> *)&gtest_ar_5,&bd);
  bd.super_Tuple3<pbrt::Vector3,_long_double>._12_4_ = gtest_ar_5.message_.ptr_._4_4_;
  bd.super_Tuple3<pbrt::Vector3,_long_double>._8_4_ = gtest_ar_5.message_.ptr_._0_4_;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x._0_1_ = gtest_ar_5.success_;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.x._1_7_ = gtest_ar_5._1_7_;
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_138.y * local_68.y)),ZEXT416((uint)local_138.x),
                            ZEXT416((uint)local_68.x));
  auVar28 = vfmadd132ss_fma(ZEXT416((uint)local_138.z),auVar28,ZEXT416((uint)local_68.z));
  bd.super_Tuple3<pbrt::Vector3,_long_double>.y._8_2_ = uVar20;
  bd.super_Tuple3<pbrt::Vector3,_long_double>._26_6_ = uVar21;
  bd.super_Tuple3<pbrt::Vector3,_long_double>.z._8_2_ = uVar22;
  bd.super_Tuple3<pbrt::Vector3,_long_double>._42_6_ = uVar23;
  naive = pbrt::SafeACos(auVar28._0_4_);
  acosl();
  precise = (Float)in_ST0;
  abet = pbrt::AngleBetween<float>((Vector3<float> *)&local_138,(Vector3<float> *)&local_68);
  expected = &abet;
  auVar40._0_4_ = local_138.x + local_68.x;
  auVar40._4_4_ = local_138.y + local_68.y;
  auVar40._8_8_ = 0;
  gtest_ar_5.message_.ptr_._0_4_ = local_138.z + local_68.z;
  gtest_ar_5._0_8_ = vmovlps_avx(auVar40);
  tVar32 = pbrt::Length<float>((Vector3<float> *)&gtest_ar_5);
  pbrt::SafeASin(tVar32 * 0.5);
  testing::internal::CmpHelperEQ<float,float>((internal *)&rng,"abet","precise",expected,&precise);
  if ((char)rng.state == '\0') {
    testing::Message::Message((Message *)&local_148);
    pbrt::StringPrintf<float&>((string *)&gtest_ar_5,(pbrt *)"vs naive %f",(char *)&naive,expected);
    std::operator<<((ostream *)(local_148.ptr_ + 0x10),(string *)&gtest_ar_5);
    if (rng.inc == 0) {
      pcVar26 = "";
    }
    else {
      pcVar26 = *(char **)rng.inc;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0x91,pcVar26);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_148);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&rng.inc);
  return;
}

Assistant:

TEST(Vector, AngleBetween) {
    EXPECT_EQ(0, AngleBetween(Vector3f(1, 0, 0), Vector3f(1, 0, 0)));

    EXPECT_LT(std::abs(AngleBetween(Vector3f(0, 0, 1), Vector3f(0, 0, -1))) - Pi, 1e-7);
    EXPECT_LT(std::abs(AngleBetween(Vector3f(1, 0, 0), Vector3f(0, 1, 0))) - Pi / 2,
              1e-7);

    Vector3f x = Normalize(Vector3f(1, -3, 10));
    EXPECT_EQ(0, AngleBetween(x, x));
    EXPECT_LT(std::abs(AngleBetween(x, -x) - Pi), 3e-7);

    Float maxErr = 0, sumErr = 0;
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;
    maxErr = 0;
    sumErr = 0;

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i + 10000000);
        Vector3f a = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        Vector3f b = Normalize(Vector3f(-1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>(),
                                        -1 + 2 * rng.Uniform<Float>()));
        // Make them face in opposite-ish directions
        a.x = std::copysign(a.x, -b.x);
        a.y = std::copysign(a.y, -b.y);
        a.z = std::copysign(a.z, -b.z);

        Vector3<double> ad(a), bd(b);
        ad = Normalize(ad);
        bd = Normalize(bd);

        Float v[2] = {Float(std::acos(Dot(ad, bd))), AngleBetween(a, b)};
        Float err = std::abs(v[0] - v[1]) / v[0];
        maxErr = std::max(err, maxErr);
        sumErr += err;
        EXPECT_LT(err, 5e-6) << v[0] << "vs " << v[1] << ", a: " << a << ", b: " << b;
    }
    // CO    LOG(WARNING) << "MAXERR " << maxErr << ", sum " << sumErr;

    Vector3f a(1, 1, 1), b(-1, -1.0001, -1);
    a = Normalize(a);
    b = Normalize(b);
    Vector3<long double> ad(1, 1, 1), bd(-1, -1.0001, -1);
    ad = Normalize(ad);
    bd = Normalize(bd);

    Float naive = SafeACos(Dot(a, b));
    Float precise = std::acos(Clamp(Dot(ad, bd), -1, 1));
    Float abet = AngleBetween(a, b);
    Float old = Pi - 2 * SafeASin(Length(a + b) / 2);
    EXPECT_EQ(abet, precise) << StringPrintf("vs naive %f", naive);
    // CO    LOG(WARNING) << StringPrintf("naive %f (err %f), abet %f (err %f)
    // old %f (err %f)", CO                                 naive,
    // std::abs(naive
    // - precise) / precise, CO                                 abet,
    // std::abs(abet - precise) / precise, CO old, std::abs(old - precise) /
    // precise);
}